

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocket::startClientEncryption(QSslSocket *this)

{
  QSslSocketPrivate *this_00;
  TlsCryptograph *pTVar1;
  bool bVar2;
  SocketState SVar3;
  QLoggingCategory *pQVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (this_00->mode == UnencryptedMode) {
    SVar3 = QAbstractSocket::state((QAbstractSocket *)this);
    if (SVar3 == ConnectedState) {
      bVar2 = QSslSocketPrivate::supportsSsl();
      if (bVar2) {
        bVar2 = QSslSocketPrivate::verifyProtocolSupported
                          (this_00,"QSslSocket::startClientEncryption:");
        if (bVar2) {
          this_00->mode = SslClientMode;
          modeChanged(this,SslClientMode);
          pTVar1 = (this_00->backend)._M_t.
                   super___uniq_ptr_impl<QTlsPrivate::TlsCryptograph,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QTlsPrivate::TlsCryptograph_*,_std::default_delete<QTlsPrivate::TlsCryptograph>_>
                   .super__Head_base<0UL,_QTlsPrivate::TlsCryptograph_*,_false>._M_head_impl;
          if (pTVar1 != (TlsCryptograph *)0x0) {
            if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
              (**(code **)(*(long *)pTVar1 + 0x80))();
              return;
            }
            goto LAB_002314d9;
          }
        }
      }
      else {
        pQVar4 = QtPrivateLogging::lcSsl();
        if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_20 = pQVar4->name;
          local_38.d._0_4_ = 2;
          local_38._4_8_ = 0;
          local_38._12_8_ = 0;
          local_38.size._4_4_ = 0;
          QMessageLogger::warning
                    ((char *)&local_38,
                     "QSslSocket::startClientEncryption: TLS initialization failed");
        }
        tr((QString *)&local_38,"TLS initialization failed",(char *)0x0,-1);
        QAbstractSocketPrivate::setErrorAndEmit
                  ((QAbstractSocketPrivate *)this_00,SslInternalError,(QString *)&local_38);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      }
    }
    else {
      pQVar4 = QtPrivateLogging::lcSsl();
      if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_20 = pQVar4->name;
        pcVar5 = "QSslSocket::startClientEncryption: cannot start handshake when not connected";
        goto LAB_00231452;
      }
    }
  }
  else {
    pQVar4 = QtPrivateLogging::lcSsl();
    if (((pQVar4->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_20 = pQVar4->name;
      pcVar5 = "QSslSocket::startClientEncryption: cannot start handshake on non-plain connection";
LAB_00231452:
      local_38.size._4_4_ = 0;
      local_38._12_8_ = 0;
      local_38._4_8_ = 0;
      local_38.d._0_4_ = 2;
      QMessageLogger::warning((char *)&local_38,pcVar5);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_002314d9:
  __stack_chk_fail();
}

Assistant:

void QSslSocket::startClientEncryption()
{
    Q_D(QSslSocket);
    if (d->mode != UnencryptedMode) {
        qCWarning(lcSsl,
                  "QSslSocket::startClientEncryption: cannot start handshake on non-plain connection");
        return;
    }
    if (state() != ConnectedState) {
        qCWarning(lcSsl,
                  "QSslSocket::startClientEncryption: cannot start handshake when not connected");
        return;
    }

    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::startClientEncryption: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }

    if (!d->verifyProtocolSupported("QSslSocket::startClientEncryption:"))
        return;

#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::startClientEncryption()";
#endif
    d->mode = SslClientMode;
    emit modeChanged(d->mode);
    d->startClientEncryption();
}